

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge_util.cpp
# Opt level: O0

void __thiscall
spvtools::opt::blockmergeutil::anon_unknown_0::EliminateOpPhiInstructions::anon_class_8_1_bc11688f::
operator()(anon_class_8_1_bc11688f *this,Instruction *phi)

{
  IRContext *this_00;
  uint32_t uVar1;
  uint32_t after;
  Instruction *phi_local;
  anon_class_8_1_bc11688f *this_local;
  
  uVar1 = opt::Instruction::NumInOperands(phi);
  if (uVar1 != 2) {
    __assert_fail("2 == phi->NumInOperands() && \"A block can only have one predecessor for block merging to make \" \"sense.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/block_merge_util.cpp"
                  ,0x47,
                  "auto spvtools::opt::blockmergeutil::(anonymous namespace)::EliminateOpPhiInstructions(IRContext *, BasicBlock *)::(anonymous class)::operator()(Instruction *) const"
                 );
  }
  this_00 = this->context;
  uVar1 = opt::Instruction::result_id(phi);
  after = opt::Instruction::GetSingleWordInOperand(phi,0);
  IRContext::ReplaceAllUsesWith(this_00,uVar1,after);
  IRContext::KillInst(this->context,phi);
  return;
}

Assistant:

void EliminateOpPhiInstructions(IRContext* context, BasicBlock* block) {
  block->ForEachPhiInst([context](Instruction* phi) {
    assert(2 == phi->NumInOperands() &&
           "A block can only have one predecessor for block merging to make "
           "sense.");
    context->ReplaceAllUsesWith(phi->result_id(),
                                phi->GetSingleWordInOperand(0));
    context->KillInst(phi);
  });
}